

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void leveldb::AppendEscapedStringTo(string *str,Slice *value)

{
  ulong uVar1;
  size_t sVar2;
  Slice *in_RSI;
  char *in_RDI;
  char buf [10];
  char c;
  size_t i;
  char local_23 [10];
  byte local_19;
  ulong local_18;
  Slice *local_10;
  char *local_8;
  
  local_18 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    uVar1 = local_18;
    sVar2 = Slice::size(local_10);
    if (sVar2 <= uVar1) break;
    local_19 = Slice::operator[](local_10,local_18);
    if (((char)local_19 < ' ') || ('~' < (char)local_19)) {
      snprintf(local_23,10,"\\x%02x",(ulong)local_19);
      std::__cxx11::string::append(local_8);
    }
    else {
      std::__cxx11::string::push_back((char)local_8);
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void AppendEscapedStringTo(std::string* str, const Slice& value) {
  for (size_t i = 0; i < value.size(); i++) {
    char c = value[i];
    if (c >= ' ' && c <= '~') {
      str->push_back(c);
    } else {
      char buf[10];
      snprintf(buf, sizeof(buf), "\\x%02x",
               static_cast<unsigned int>(c) & 0xff);
      str->append(buf);
    }
  }
}